

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void gen_memset(c2m_ctx_t c2m_ctx,MIR_disp_t disp,MIR_reg_t base,mir_size_t len)

{
  gen_ctx_conflict *pgVar1;
  MIR_context_t ctx;
  MIR_module_t module;
  MIR_item_t_conflict pMVar2;
  MIR_insn_t_conflict pMVar3;
  MIR_type_t ret_type;
  void *local_2e8;
  undefined8 uStack_2e0;
  int64_t iStack_2d8;
  char *pcStack_2d0;
  undefined8 uStack_2c8;
  MIR_disp_t MStack_2c0;
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 uStack_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  op_t local_228;
  op_t local_1e8;
  MIR_var_t vars [3];
  MIR_op_t local_158;
  void *pvStack_128;
  undefined8 uStack_120;
  int64_t local_118;
  char *pcStack_110;
  undefined8 uStack_108;
  MIR_disp_t MStack_100;
  void *pvStack_f8;
  undefined8 uStack_f0;
  int64_t local_e8;
  char *pcStack_e0;
  undefined8 uStack_d8;
  MIR_disp_t MStack_d0;
  void *pvStack_c8;
  undefined8 uStack_c0;
  int64_t local_b8;
  char *pcStack_b0;
  undefined8 uStack_a8;
  MIR_disp_t MStack_a0;
  undefined8 uStack_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  
  pgVar1 = c2m_ctx->gen_ctx;
  ctx = c2m_ctx->ctx;
  if (pgVar1->memset_item == (MIR_item_t)0x0) {
    vars[0].name = "s";
    ret_type = MIR_T_I64;
    vars[1].name = "c";
    vars[1].type = MIR_T_I32;
    vars[2].name = "n";
    module = pgVar1->curr_func->module;
    vars[0].type = ret_type;
    vars[2].type = ret_type;
    pMVar2 = MIR_new_proto_arr(ctx,"memset_p",1,&ret_type,3,vars);
    pgVar1->memset_proto = pMVar2;
    pMVar2 = MIR_new_import(ctx,"memset");
    pgVar1->memset_item = pMVar2;
    move_item_to_module_start(module,pgVar1->memset_proto);
    move_item_to_module_start(module,pgVar1->memset_item);
  }
  MIR_new_ref_op(ctx,pgVar1->memset_proto);
  MIR_new_ref_op(ctx,pgVar1->memset_item);
  uStack_108 = uStack_2c8;
  MStack_100 = MStack_2c0;
  pvStack_128 = local_2e8;
  uStack_120 = uStack_2e0;
  local_118 = iStack_2d8;
  pcStack_110 = pcStack_2d0;
  get_new_temp(&local_1e8,c2m_ctx,MIR_T_I64);
  uStack_d8 = local_1e8.mir_op.u._16_8_;
  MStack_d0 = local_1e8.mir_op.u.mem.disp;
  pvStack_f8 = local_1e8.mir_op.data;
  uStack_f0 = local_1e8.mir_op._8_8_;
  local_e8 = local_1e8.mir_op.u.i;
  pcStack_e0 = local_1e8.mir_op.u.str.s;
  if (disp == 0) {
    MIR_new_reg_op(ctx,base);
  }
  else {
    get_new_temp(&local_228,c2m_ctx,MIR_T_I64);
    uStack_2c8 = local_228.mir_op.u._16_8_;
    MStack_2c0 = local_228.mir_op.u.mem.disp;
    local_2e8 = local_228.mir_op.data;
    uStack_2e0 = local_228.mir_op._8_8_;
    iStack_2d8 = local_228.mir_op.u.i;
    pcStack_2d0 = local_228.mir_op.u.str.s;
    MIR_new_reg_op(ctx,base);
    MIR_new_int_op(ctx,disp);
    pMVar3 = MIR_new_insn(c2m_ctx->ctx,MIR_ADD);
    emit_insn_opt(c2m_ctx,pMVar3);
  }
  uStack_a8 = uStack_2c8;
  MStack_a0 = MStack_2c0;
  pvStack_c8 = local_2e8;
  uStack_c0 = uStack_2e0;
  local_b8 = iStack_2d8;
  pcStack_b0 = pcStack_2d0;
  MIR_new_int_op(ctx,0);
  uStack_78 = uStack_298;
  uStack_70 = uStack_290;
  uStack_98 = local_2b8;
  uStack_90 = uStack_2b0;
  local_88 = uStack_2a8;
  uStack_80 = uStack_2a0;
  MIR_new_uint_op(ctx,len);
  uStack_48 = uStack_298;
  uStack_40 = uStack_290;
  uStack_68 = local_2b8;
  uStack_60 = uStack_2b0;
  local_58 = uStack_2a8;
  uStack_50 = uStack_2a0;
  pMVar3 = MIR_new_insn_arr(ctx,MIR_CALL,6,&local_158);
  emit_insn(c2m_ctx,pMVar3);
  return;
}

Assistant:

static void gen_memset (c2m_ctx_t c2m_ctx, MIR_disp_t disp, MIR_reg_t base, mir_size_t len) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  MIR_context_t ctx = c2m_ctx->ctx;
  MIR_type_t ret_type;
  MIR_var_t vars[3];
  MIR_op_t treg_op, args[6];
  MIR_module_t module;

  if (memset_item == NULL) {
    ret_type = get_int_mir_type (sizeof (mir_size_t));
    vars[0].name = "s";
    vars[0].type = get_int_mir_type (sizeof (mir_size_t));
    vars[1].name = "c";
    vars[1].type = get_int_mir_type (sizeof (mir_int));
    vars[2].name = "n";
    vars[2].type = get_int_mir_type (sizeof (mir_size_t));
    module = curr_func->module;
    memset_proto = MIR_new_proto_arr (ctx, "memset_p", 1, &ret_type, 3, vars);
    memset_item = MIR_new_import (ctx, "memset");
    move_item_to_module_start (module, memset_proto);
    move_item_to_module_start (module, memset_item);
  }
  args[0] = MIR_new_ref_op (ctx, memset_proto);
  args[1] = MIR_new_ref_op (ctx, memset_item);
  args[2] = get_new_temp (c2m_ctx, get_int_mir_type (sizeof (mir_size_t))).mir_op;
  if (disp == 0) {
    treg_op = MIR_new_reg_op (ctx, base);
  } else {
    treg_op = get_new_temp (c2m_ctx, get_int_mir_type (sizeof (mir_size_t))).mir_op;
    emit3 (c2m_ctx, MIR_ADD, treg_op, MIR_new_reg_op (ctx, base), MIR_new_int_op (ctx, disp));
  }
  args[3] = treg_op;
  args[4] = MIR_new_int_op (ctx, 0);
  args[5] = MIR_new_uint_op (ctx, len);
  emit_insn (c2m_ctx, MIR_new_insn_arr (ctx, MIR_CALL, 6 /* args + proto + func + res */, args));
}